

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_parse_regexp(JSParseState *s)

{
  byte bVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint32_t c;
  int iVar4;
  int iVar5;
  byte *p;
  char *fmt;
  uint c_00;
  byte *p_00;
  byte *pbVar6;
  bool bVar7;
  JSValue JVar8;
  uint8_t *p_next_1;
  uint8_t *p_next;
  StringBuffer local_70;
  StringBuffer local_50;
  
  local_50.ctx = s->ctx;
  puVar2 = s->buf_ptr;
  local_50.len = 0;
  local_50.size = 0x20;
  local_50.is_wide_char = 0;
  local_50.error_status = 0;
  local_50.str = js_alloc_string(local_50.ctx,0x20,0);
  if (local_50.str == (JSString *)0x0) {
    return -1;
  }
  local_70.ctx = s->ctx;
  local_70.len = 0;
  local_70.size = 1;
  local_70.is_wide_char = 0;
  local_70.error_status = 0;
  bVar7 = false;
  local_70.str = js_alloc_string(local_70.ctx,1,0);
  if (local_70.str != (JSString *)0x0) {
    p_00 = puVar2 + 1;
    do {
      if (s->buf_end <= p_00) {
LAB_0010d75a:
        fmt = "unexpected end of regexp";
        goto LAB_0010d81b;
      }
      p = p_00 + 1;
      bVar1 = *p_00;
      c = (uint32_t)bVar1;
      pbVar6 = p;
      bVar3 = true;
      if (bVar1 == 0x2f) {
        if (!bVar7) {
          goto LAB_0010d777;
        }
        c = 0x2f;
      }
      else if (bVar1 != 0x5b) {
        bVar3 = bVar7;
        if (bVar1 == 0x5c) {
          iVar5 = string_buffer_putc8(&local_50,0x5c);
          if (iVar5 != 0) break;
          bVar1 = p_00[1];
          pbVar6 = p_00 + 2;
          c = (uint32_t)bVar1;
          if (bVar1 == 0) {
            c = 0;
            if (s->buf_end <= pbVar6) goto LAB_0010d75a;
          }
          else {
            if ((c == 10) || (c == 0xd)) {
LAB_0010d814:
              fmt = "unexpected line terminator in regexp";
              goto LAB_0010d81b;
            }
            if ((char)bVar1 < '\0') {
              c = unicode_from_utf8(p,6,&p_next_1);
              iVar5 = 0;
              if ((c & 0x1ffffe) == 0x2028) {
                iVar5 = 6;
              }
              iVar4 = 7;
              if (c < 0x110000) {
                pbVar6 = p_next_1;
                iVar4 = iVar5;
              }
              if (iVar4 != 0) {
                if (iVar4 == 6) goto LAB_0010d814;
                if (iVar4 != 7) {
                  return iVar5;
                }
                goto LAB_0010d80b;
              }
            }
          }
        }
        else if (bVar1 == 0x5d) {
          c = 0x5d;
          bVar3 = false;
        }
        else {
          if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_0010d814;
          c = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            c = unicode_from_utf8(p_00,6,&p_next);
            if (0x10ffff < c) goto LAB_0010d80b;
            pbVar6 = p_next;
            if ((c & 0x1ffffe) == 0x2028) goto LAB_0010d814;
          }
        }
      }
      bVar7 = bVar3;
      iVar5 = string_buffer_putc(&local_50,c);
      p_00 = pbVar6;
    } while (iVar5 == 0);
  }
  goto LAB_0010d825;
LAB_0010d80b:
  fmt = "invalid UTF-8 sequence";
LAB_0010d81b:
  js_parse_error(s,fmt);
  goto LAB_0010d825;
  while( true ) {
    if (c_00 < 0x80) {
      bVar7 = (lre_id_continue_table_ascii[c_00 >> 5] >> (c_00 & 0x1f) & 1) != 0;
    }
    else {
      iVar5 = lre_is_id_continue(c_00);
      bVar7 = (c_00 & 0x1ffffe) == 0x200c || iVar5 != 0;
    }
    if (!bVar7) {
      (s->token).val = -0x7c;
      JVar8 = string_buffer_end(&local_50);
      (s->token).u.str.str = JVar8;
      JVar8 = string_buffer_end(&local_70);
      (s->token).u.regexp.flags = JVar8;
      s->buf_ptr = p;
      return 0;
    }
    iVar5 = string_buffer_putc(&local_70,c_00);
    p = p_next_1;
    if (iVar5 != 0) break;
LAB_0010d777:
    p_next_1 = p + 1;
    c_00 = (uint)(char)*p;
    if (((char)*p < '\0') && (c_00 = unicode_from_utf8(p,6,&p_next_1), 0x10ffff < c_00))
    goto LAB_0010d80b;
  }
LAB_0010d825:
  (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
  (*((local_70.ctx)->rt->mf).js_free)(&(local_70.ctx)->rt->malloc_state,local_70.str);
  return -1;
}

Assistant:

static __exception int js_parse_regexp(JSParseState *s)
{
    const uint8_t *p;
    BOOL in_class;
    StringBuffer b_s, *b = &b_s;
    StringBuffer b2_s, *b2 = &b2_s;
    uint32_t c;

    p = s->buf_ptr;
    p++;
    in_class = FALSE;
    if (string_buffer_init(s->ctx, b, 32))
        return -1;
    if (string_buffer_init(s->ctx, b2, 1))
        goto fail;
    for(;;) {
        if (p >= s->buf_end) {
        eof_error:
            js_parse_error(s, "unexpected end of regexp");
            goto fail;
        }
        c = *p++;
        if (c == '\n' || c == '\r') {
            goto eol_error;
        } else if (c == '/') {
            if (!in_class)
                break;
        } else if (c == '[') {
            in_class = TRUE;
        } else if (c == ']') {
            /* XXX: incorrect as the first character in a class */
            in_class = FALSE;
        } else if (c == '\\') {
            if (string_buffer_putc8(b, c))
                goto fail;
            c = *p++;
            if (c == '\n' || c == '\r')
                goto eol_error;
            else if (c == '\0' && p >= s->buf_end)
                goto eof_error;
            else if (c >= 0x80) {
                const uint8_t *p_next;
                c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
                if (c > 0x10FFFF) {
                    goto invalid_utf8;
                }
                p = p_next;
                if (c == CP_LS || c == CP_PS)
                    goto eol_error;
            }
        } else if (c >= 0x80) {
            const uint8_t *p_next;
            c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
            invalid_utf8:
                js_parse_error(s, "invalid UTF-8 sequence");
                goto fail;
            }
            p = p_next;
            /* LS or PS are considered as line terminator */
            if (c == CP_LS || c == CP_PS) {
            eol_error:
                js_parse_error(s, "unexpected line terminator in regexp");
                goto fail;
            }
        }
        if (string_buffer_putc(b, c))
            goto fail;
    }

    /* flags */
    for(;;) {
        const uint8_t *p_next = p;
        c = *p_next++;
        if (c >= 0x80) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
                goto invalid_utf8;
            }
        }
        if (!lre_js_is_ident_next(c))
            break;
        if (string_buffer_putc(b2, c))
            goto fail;
        p = p_next;
    }

    s->token.val = TOK_REGEXP;
    s->token.u.regexp.body = string_buffer_end(b);
    s->token.u.regexp.flags = string_buffer_end(b2);
    s->buf_ptr = p;
    return 0;
 fail:
    string_buffer_free(b);
    string_buffer_free(b2);
    return -1;
}